

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ym2612_Emu.cpp
# Opt level: O2

void __thiscall Ym2612_Impl::write1(Ym2612_Impl *this,int opn_addr,int data)

{
  if ((0x2f < opn_addr) && ((this->YM2612).REG[1][(uint)opn_addr] != data)) {
    (this->YM2612).REG[1][(uint)opn_addr] = data;
    if ((uint)opn_addr < 0xa0) {
      SLOT_SET(this,opn_addr | 0x100,data);
      return;
    }
    CHANNEL_SET(this,opn_addr + 0x100,data);
    return;
  }
  return;
}

Assistant:

inline void Ym2612_Impl::write1( int opn_addr, int data )
{
	assert( (unsigned) data <= 0xFF );
	
	if ( opn_addr >= 0x30 && YM2612.REG [1] [opn_addr] != data )
	{
		YM2612.REG [1] [opn_addr] = data;

		if ( opn_addr < 0xA0 )
			SLOT_SET( opn_addr + 0x100, data );
		else
			CHANNEL_SET( opn_addr + 0x100, data );
	}
}